

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_throw(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CClass *this;
  int *piVar8;
  long lVar9;
  CHAR_DATA *in_RDI;
  char arg [4608];
  int chance;
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffed08;
  int in_stack_ffffffffffffed0c;
  int in_stack_ffffffffffffed10;
  undefined4 in_stack_ffffffffffffed14;
  CHAR_DATA *in_stack_ffffffffffffed18;
  char_data *in_stack_ffffffffffffed20;
  CHAR_DATA *in_stack_ffffffffffffed28;
  CHAR_DATA *in_stack_ffffffffffffed30;
  CHAR_DATA *pCVar10;
  undefined4 in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  CHAR_DATA *in_stack_ffffffffffffed40;
  int local_12a0;
  int local_129c;
  int local_1298;
  int local_1294 [3];
  char local_1288;
  int in_stack_ffffffffffffede4;
  undefined1 in_stack_ffffffffffffedeb;
  int in_stack_ffffffffffffedec;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  int in_stack_ffffffffffffee0c;
  CHAR_DATA *in_stack_ffffffffffffee10;
  char *in_stack_ffffffffffffff10;
  CHAR_DATA *in_stack_ffffffffffffff18;
  CHAR_DATA *local_18;
  
  iVar4 = get_skill(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
  if (iVar4 != 0) {
    sVar1 = in_RDI->level;
    lVar9 = (long)gsn_throw;
    this = char_data::Class(in_stack_ffffffffffffed20);
    iVar5 = CClass::GetIndex(this);
    if (*(short *)(lVar9 * 0x60 + 0x8daef8 + (long)iVar5 * 2) <= sVar1) {
      one_argument((char *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                   (char *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
      if (local_1288 == '\0') {
        local_18 = in_RDI->fighting;
      }
      else {
        local_18 = get_char_room(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
      if (local_18 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18);
        return;
      }
      if (local_18 == in_RDI) {
        send_to_char((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18);
        return;
      }
      if ((local_18->fighting != in_RDI) && (in_RDI->fighting != local_18)) {
        send_to_char((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18);
        return;
      }
      bVar3 = is_affected(local_18,(int)gsn_protective_shield);
      if (bVar3) {
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        WAIT_STATE(in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20));
        return;
      }
      bVar3 = is_affected(local_18,(int)gsn_sanguine_ward);
      if (bVar3) {
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        WAIT_STATE(in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20));
        return;
      }
      bVar3 = is_affected(local_18,(int)gsn_heatshield);
      if (bVar3) {
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        WAIT_STATE(in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20));
        dice(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
        damage_old(local_18,(CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                   (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                   (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffed28 >> 0x18,0));
        return;
      }
      bVar3 = is_affected(local_18,(int)gsn_elecshield);
      if (!bVar3) {
        bVar3 = is_affected(local_18,(int)gsn_airshield);
        if (bVar3) {
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          iVar4 = (int)((ulong)in_stack_ffffffffffffed18 >> 0x20);
          dice(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
          damage_old(in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                     (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                     (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffed28 >> 0x18,0));
          WAIT_STATE(in_stack_ffffffffffffed20,iVar4);
          return;
        }
        bVar3 = is_affected(local_18,(int)gsn_earthshield);
        if (bVar3) {
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          dice(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
          iVar4 = (int)((ulong)local_18 >> 0x20);
          damage_old(in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                     (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                     (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffed28 >> 0x18,0));
          init_affect((AFFECT_DATA *)0x5eaa2a);
          palloc_string((char *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                         (AFFECT_DATA *)
                         CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
                         (AFFECT_DATA *)
                         CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
          WAIT_STATE(in_RDI,iVar4);
          return;
        }
        bVar3 = is_affected(local_18,(int)gsn_watershield);
        if (bVar3) {
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
              (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
              (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
          iVar4 = dice(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
          damage_old(in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                     (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                     (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffed28 >> 0x18,0));
          local_1294[0] = local_18->hit + iVar4;
          local_1298 = (int)local_18->max_hit;
          piVar8 = std::min<int>(local_1294,&local_1298);
          local_18->hit = *piVar8;
          bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08))
          ;
          if (bVar3) {
            return;
          }
          in_RDI->pcdata->condition[2] = in_RDI->pcdata->condition[2] + 8;
          local_129c = (int)in_RDI->pcdata->condition[2];
          local_12a0 = 0x32;
          piVar8 = std::min<int>(&local_129c,&local_12a0);
          in_RDI->pcdata->condition[2] = (short)*piVar8;
          return;
        }
        bVar3 = is_affected(local_18,(int)gsn_coldshield);
        if (!bVar3) {
          sVar1 = in_RDI->level;
          sVar2 = local_18->level;
          iVar5 = get_curr_stat(in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c);
          iVar6 = get_curr_stat(in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c);
          iVar4 = ((iVar6 / 2 + ((((int)sVar1 - (int)sVar2) + iVar4) - iVar5)) * 9) / 10;
          if (iVar4 < 5) {
            iVar4 = in_stack_ffffffffffffed10;
            iVar5 = 5;
          }
          else {
            iVar5 = iVar4;
            if (0x5a < iVar4) {
              iVar4 = 0x5a;
              iVar5 = iVar4;
            }
          }
          iVar6 = iVar5;
          iVar7 = number_percent();
          if (iVar5 < iVar7) {
            check_improve(in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec,
                          (bool)in_stack_ffffffffffffedeb,in_stack_ffffffffffffede4);
            iVar5 = (int)((ulong)in_stack_ffffffffffffed18 >> 0x20);
          }
          else {
            act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
                (void *)CONCAT44(iVar6,iVar4),
                (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
            act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
                (void *)CONCAT44(iVar6,iVar4),
                (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
            act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
                (void *)CONCAT44(iVar6,iVar4),
                (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
            iVar5 = (int)((ulong)in_stack_ffffffffffffed18 >> 0x20);
            get_curr_stat(in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c);
            check_improve(in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec,
                          (bool)in_stack_ffffffffffffedeb,in_stack_ffffffffffffede4);
            LAG_CHAR((CHAR_DATA *)CONCAT44(iVar6,iVar4),in_stack_ffffffffffffed0c);
          }
          damage_old(in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                     (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),(int)in_stack_ffffffffffffed30,
                     (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffed28 >> 0x18,0));
          WAIT_STATE(in_stack_ffffffffffffed20,iVar5);
          if (in_RDI->fighting != local_18) {
            return;
          }
          check_ground_control
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,
                     (float)((ulong)in_stack_ffffffffffffed20 >> 0x20),
                     (int)in_stack_ffffffffffffed20);
          return;
        }
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
            (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
            (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
        iVar4 = (int)((ulong)in_stack_ffffffffffffed18 >> 0x20);
        (*skill_table[gsn_chill].spell_fun)((int)gsn_chill,(int)in_RDI->level,local_18,in_RDI,1);
        WAIT_STATE(in_stack_ffffffffffffed20,iVar4);
        return;
      }
      act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
          (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
          (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
      act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
          (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
          (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
      act((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
          (void *)CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
          (void *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),0);
      WAIT_STATE(in_stack_ffffffffffffed20,(int)((ulong)in_stack_ffffffffffffed18 >> 0x20));
      pCVar10 = in_RDI;
      dice(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
      damage_old(in_stack_ffffffffffffed40,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                 (int)((ulong)pCVar10 >> 0x20),(int)pCVar10,(int)((ulong)local_18 >> 0x20),
                 SUB81((ulong)local_18 >> 0x18,0));
      iVar4 = in_RDI->hit;
      local_1294[2] = dice(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
      local_1294[2] = iVar4 - local_1294[2];
      local_1294[1] = 0;
      piVar8 = std::max<int>(local_1294 + 2,local_1294 + 1);
      in_RDI->hit = *piVar8;
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffed20,in_stack_ffffffffffffed18);
  return;
}

Assistant:

void do_throw(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;
	int dam, chance;
	char arg[MAX_INPUT_LENGTH];

	chance = get_skill(ch, gsn_throw);

	if (chance == 0
		|| ch->level < skill_table[gsn_throw].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Throwing? What's that?\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Now that would be a bit stupid.\n\r", ch);
		return;
	}

	if ((victim->fighting != ch) && (ch->fighting != victim))
	{
		send_to_char("But you aren't engaged in combat with them.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_protective_shield))
	{
		act("$N's throw seems to slide around you.", victim, 0, ch, TO_CHAR);
		act("$N's throw seems to slide around $n.", victim, 0, ch, TO_NOTVICT);
		act("Your throw seems to slide around $n.", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	if (is_affected(victim, gsn_sanguine_ward))
	{
		act("$N tries to throw you but your sanguine ward keeps $M at bay.", victim, 0, ch, TO_CHAR);
		act("$n's ward flares brightly as $N tries to throw $m, deflecting the attack!", victim, 0, ch, TO_NOTVICT);
		act("$n's ward flares brightly as you try to throw $m, sending you flying back!", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 1);
		return;
	}

	if (is_affected(victim, gsn_heatshield))
	{
		act("$N tries to throw you but is stopped by a wave of searing heat.", victim, 0, ch, TO_CHAR);
		act("$N tries to throw $n but a wave of searing heat stops him.", victim, 0, ch, TO_NOTVICT);
		act("You try to throw $n but a wave of searing heat stops you!", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 1);
		damage_old(victim, ch, dice(8, 10), gsn_heatshield, DAM_FIRE, true);
		return;
	}

	if (is_affected(victim, gsn_elecshield))
	{
		act("$N attempts to throw you, but collides with your electric shield.", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but collides with $s electric shield.", victim, 0, ch, TO_NOTVICT);
		act("You are stopped by an electric field, shocking you and sapping your energy!", victim, 0, ch, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 1);

		damage_old(victim, ch, dice(2, 10), gsn_elecshield, DAM_LIGHTNING, true);
		ch->hit = std::max(ch->hit - dice(5, 10), 0);
		return;
	}

	if (is_affected(victim, gsn_airshield))
	{
		act("$N attempts to throw you, but a curtain of swirling winds throws $M back!", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but a curtain of swirling winds throws $M back!", victim, 0, ch, TO_NOTVICT);
		act("You try to throw $n but a curtain of swirling winds throw you back!", victim, 0, ch, TO_VICT);

		dam = dice(2, 10);
		damage_old(victim, ch, dam, gsn_airshield, DAM_DROWNING, true);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	if (is_affected(victim, gsn_earthshield))
	{
		act("$N attempts to throw you, but collides with your earthshield.", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but instead collides with a solid barrier.", victim, 0, ch, TO_NOTVICT);
		act("Your hear your bones crack as you slam into a rock-hard shield around $n.", victim, 0, ch, TO_VICT);
		damage_old(victim, ch, dice(2, 10), gsn_earthshield, DAM_BASH, true);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = gsn_shattered_bone;
		af.name = palloc_string("broken bones");
		af.level = ch->level;
		af.duration = ch->level / 5;
		af.location = APPLY_STR;
		af.modifier = -1;
		affect_to_char(ch, &af);

		af.location = APPLY_DEX;
		af.modifier = -1;
		affect_to_char(ch, &af);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	if (is_affected(victim, gsn_watershield))
	{
		act("$N attempts to throw you, and you feel slightly invigorated as $E crashes into your watershield.", victim, 0, ch, TO_CHAR);
		act("$n looks slightly invigorated as $N crashes into $s watershield.", victim, 0, ch, TO_NOTVICT);
		act("You feel drained as your mass collides with $n's shield of swirling water.", victim, 0, ch, TO_VICT);

		dam = dice(3, 10);
		damage_old(victim, ch, dam, gsn_watershield, DAM_DROWNING, true);
		victim->hit = std::min(victim->hit + dam, (int)victim->max_hit);

		if (!is_npc(ch))
		{
			ch->pcdata->condition[COND_THIRST] += 8;
			ch->pcdata->condition[COND_THIRST] = std::min((int)ch->pcdata->condition[COND_THIRST], COND_HUNGRY);
		}

		return;
	}

	if (is_affected(victim, gsn_coldshield))
	{
		act("$N attempts to throw you, but is stopped by a wave of freezing air.", victim, 0, ch, TO_CHAR);
		act("$N attempts to throw $n, but is stopped by a wave of freezing air.", victim, 0, ch, TO_NOTVICT);
		act("You attempt to throw $n, but are seared by a wave of freezing air.", victim, 0, ch, TO_VICT);
		(*skill_table[gsn_chill].spell_fun)(gsn_chill, ch->level, victim, ch, TAR_CHAR_OFFENSIVE);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	chance += (ch->level - victim->level);
	chance -= get_curr_stat(victim, STAT_DEX);
	chance += get_curr_stat(ch, STAT_DEX) / 2;
	chance *= 9;
	chance /= 10;
	chance = URANGE(5, chance, 90);

	if (number_percent() > chance)
	{
		dam = 0;
		check_improve(ch, gsn_throw, false, 3);
	}
	else
	{
		if (ch->level <= 18)
			dam = 30;
		else if (ch->level <= 22)
			dam = 35;
		else if (ch->level <= 25)
			dam = 40;
		else if (ch->level <= 28)
			dam = 45;
		else if (ch->level <= 32)
			dam = 48;
		else if (ch->level <= 35)
			dam = 52;
		else if (ch->level <= 38)
			dam = 56;
		else if (ch->level <= 40)
			dam = 60;
		else if (ch->level <= 43)
			dam = 64;
		else if (ch->level <= 45)
			dam = 68;
		else if (ch->level <= 48)
			dam = 70;
		else
			dam = 72;

		act("$n grabs $N and throws $M to the ground with stunning force!", ch, 0, victim, TO_NOTVICT);
		act("You grab $N and throw $M to the ground with stunning force!", ch, 0, victim, TO_CHAR);
		act("$n grabs you and throws you to the ground with stunning force!", ch, 0, victim, TO_VICT);

		dam += str_app[get_curr_stat(ch, STAT_STR)].todam;
		check_improve(ch, gsn_throw, true, 3);
		LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
	}

	damage_old(ch, victim, dam, gsn_throw, DAM_BASH, true);
	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);

	if (ch->fighting == victim)
		check_ground_control(ch, victim, chance, dam);
}